

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileListOperation<short,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  data_ptr_t pdVar2;
  _func_int **pp_Var3;
  short sVar4;
  Vector *pVVar5;
  idx_t iVar6;
  reference q_00;
  uint64_t uVar7;
  unsigned_long *q;
  _func_int **pp_Var8;
  idx_t n;
  Interpolator<true> interp;
  QuantileDirect<short> local_89;
  list_entry_t *local_88;
  AggregateFinalizeData *local_80;
  data_ptr_t local_78;
  vector<duckdb::QuantileValue,_true> *local_70;
  pointer local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    pVVar5 = ListVector::GetEntry(finalize_data->result);
    iVar6 = ListVector::GetListSize(finalize_data->result);
    local_80 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >>
                        3) * 0x4ec4ec4ec4ec4ec5 + iVar6);
    pdVar2 = pVVar5->data;
    local_68 = (state->v).super_vector<short,_std::allocator<short>_>.
               super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
               _M_start;
    target->offset = iVar6;
    pp_Var8 = pFVar1[4]._vptr_FunctionData;
    pp_Var3 = pFVar1[5]._vptr_FunctionData;
    local_88 = target;
    local_60 = pVVar5;
    if (pp_Var8 != pp_Var3) {
      local_70 = (vector<duckdb::QuantileValue,_true> *)(pFVar1 + 1);
      local_78 = pdVar2 + iVar6 * 2;
      iVar6 = 0;
      do {
        q_00 = vector<duckdb::QuantileValue,_true>::operator[](local_70,(size_type)*pp_Var8);
        n = (long)(state->v).super_vector<short,_std::allocator<short>_>.
                  super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)(state->v).super_vector<short,_std::allocator<short>_>.
                  super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 1;
        local_58.desc = *(bool *)&pFVar1[7]._vptr_FunctionData;
        local_58.FRN = Interpolator<true>::Index(q_00,n);
        local_58.CRN = local_58.FRN;
        local_58.begin = iVar6;
        local_58.end = n;
        sVar4 = Interpolator<true>::Operation<short,short,duckdb::QuantileDirect<short>>
                          (&local_58,local_68,local_60,&local_89);
        *(short *)(local_78 + (long)*pp_Var8 * 2) = sVar4;
        pp_Var8 = pp_Var8 + 1;
        iVar6 = local_58.FRN;
      } while (pp_Var8 != pp_Var3);
    }
    uVar7 = ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData >> 3) *
            0x4ec4ec4ec4ec4ec5;
    local_88->length = uVar7;
    ListVector::SetListSize(local_80->result,uVar7 + local_88->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}